

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderInvarianceRule5Test::initTestIterations
          (TessellationShaderInvarianceRule5Test *this)

{
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_ordering _Var1;
  pointer p_Var2;
  bool bVar3;
  undefined8 uVar4;
  pointer p_Var5;
  bool bVar6;
  int iVar7;
  deUint32 err;
  undefined4 extraout_var;
  pointer *pp_Var8;
  long lVar9;
  GLfloat aGVar10 [2];
  GLfloat aGVar11 [2];
  iterator __position;
  vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>>
  *this_00;
  bool bVar12;
  GLint gl_max_tess_gen_level_value;
  _test_iteration test;
  undefined1 local_88 [16];
  pointer local_78;
  _tessellation_primitive_mode _Stack_70;
  _tessellation_shader_vertex_ordering _Stack_6c;
  uint local_68;
  ulong local_58;
  vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>>
  *local_50;
  pointer *local_48;
  vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>>
  *local_40;
  pointer *local_38;
  
  iVar7 = (*((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar7) + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL);
  err = (**(code **)(CONCAT44(extraout_var,iVar7) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x7fe);
  local_38 = &(this->m_test_quads_iterations).
              super__Vector_base<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>>
              *)&this->m_test_quads_iterations;
  local_48 = &(this->m_test_triangles_iterations).
              super__Vector_base<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>>
              *)&this->m_test_triangles_iterations;
  bVar3 = true;
  local_58 = 0;
  lVar9 = 0;
  do {
    primitive_mode = (&DAT_01b64a34)[lVar9];
    lVar9 = 0;
    bVar6 = true;
    do {
      bVar12 = bVar6;
      _Var1 = deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices
              [lVar9];
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                ((_tessellation_levels_set *)local_88,primitive_mode,0,
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      p_Var5 = local_78;
      uVar4 = local_88._0_8_;
      local_68 = 0;
      aGVar10 = *&((pointer)(local_88._8_8_ + -0x18))->inner;
      p_Var2 = *(pointer *)((pointer)(local_88._8_8_ + -0x18))->outer;
      local_78 = *(pointer *)(((pointer)(local_88._8_8_ + -0x18))->outer + 2);
      _Stack_6c = _Var1;
      _Stack_70 = primitive_mode;
      local_88._0_8_ = aGVar10;
      local_88._8_8_ = p_Var2;
      if ((local_58 & 1) == 0) {
        __position._M_current =
             (this->m_test_quads_iterations).
             super__Vector_base<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pp_Var8 = local_38;
        this_00 = local_40;
        if (__position._M_current !=
            (this->m_test_quads_iterations).
            super__Vector_base<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00d2d102;
LAB_00d2d0dc:
        std::
        vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>>
        ::_M_realloc_insert<glcts::TessellationShaderInvarianceRule5Test::_test_iteration_const&>
                  (this_00,__position,(_test_iteration *)local_88);
        aGVar11 = aGVar10;
      }
      else {
        __position._M_current =
             (this->m_test_triangles_iterations).
             super__Vector_base<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pp_Var8 = local_48;
        this_00 = local_50;
        if (__position._M_current ==
            (this->m_test_triangles_iterations).
            super__Vector_base<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00d2d0dc;
LAB_00d2d102:
        aGVar11[0] = 0.0;
        aGVar11[1] = 0.0;
        (__position._M_current)->n_vertices = 0;
        *(pointer *)((__position._M_current)->outer_tess_levels + 2) = local_78;
        (__position._M_current)->primitive_mode = primitive_mode;
        (__position._M_current)->vertex_ordering = _Var1;
        *&(__position._M_current)->inner_tess_levels = aGVar10;
        *(pointer *)(__position._M_current)->outer_tess_levels = p_Var2;
        *pp_Var8 = *pp_Var8 + 1;
      }
      operator_delete((void *)uVar4,(long)p_Var5 - uVar4);
      lVar9 = 1;
      bVar6 = false;
    } while (bVar12);
    local_58 = CONCAT71(aGVar11._1_7_,1);
    bVar6 = !bVar3;
    bVar3 = false;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule5Test::initTestIterations()
{
	DE_ASSERT(m_test_quads_iterations.size() == 0 && m_test_triangles_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	_tessellation_shader_vertex_ordering vo_modes[] = {
		TESSELLATION_SHADER_VERTEX_ORDERING_CCW, TESSELLATION_SHADER_VERTEX_ORDERING_CW,
	};

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vo_modes		 = sizeof(vo_modes) / sizeof(vo_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vo_mode = 0; n_vo_mode < n_vo_modes; ++n_vo_mode)
		{
			_tessellation_shader_vertex_ordering vertex_ordering = vo_modes[n_vo_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for */
			_tessellation_levels_set levels_set;

			levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			/* Only use the last inner/outer level configuration, as reported by the utils function. */
			const _tessellation_levels& levels = levels_set[levels_set.size() - 1];

			/* Create a test descriptor for all the parameters we now have */
			_test_iteration test;

			memcpy(test.inner_tess_levels, levels.inner, sizeof(test.inner_tess_levels));
			memcpy(test.outer_tess_levels, levels.outer, sizeof(test.outer_tess_levels));

			test.primitive_mode  = primitive_mode;
			test.vertex_ordering = vertex_ordering;

			if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
			{
				m_test_triangles_iterations.push_back(test);
			}
			else
			{
				m_test_quads_iterations.push_back(test);
			}
		} /* for (all vertex spacing modes) */
	}	 /* for (all primitive modes) */
}